

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_acceptance.c
# Opt level: O3

REF_STATUS ref_acceptance_u(REF_NODE ref_node,char *function_name,REF_DBL *scalar)

{
  undefined1 (*pauVar1) [16];
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  double dVar5;
  int iVar6;
  uint uVar7;
  REF_DBL RVar8;
  undefined8 uVar9;
  char *pcVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  double dVar16;
  REF_DBL primitive [5];
  REF_DBL uplus1;
  double local_98;
  double dStack_90;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_38;
  
  if (0 < ref_node->max) {
    lVar12 = 2;
    lVar11 = 0;
    do {
      if (-1 < ref_node->global[lVar11]) {
        pauVar1 = (undefined1 (*) [16])(ref_node->real + lVar12 + -2);
        dVar16 = *(double *)*pauVar1;
        dVar3 = *(double *)(*pauVar1 + 8);
        auVar4 = *pauVar1;
        dVar2 = ref_node->real[lVar12];
        if (((*function_name == 'u') && (function_name[1] == '5')) && (function_name[2] == '\0')) {
          scalar[lVar11] =
               dVar2 * dVar2 + dVar2 * dVar2 +
               dVar16 * dVar16 + dVar16 * dVar16 + dVar3 * dVar3 + dVar3 * dVar3;
        }
        else {
          iVar6 = strcmp(function_name,"supcyl");
          if (iVar6 == 0) {
            dVar2 = exp((SQRT(dVar16 * dVar16 + dVar3 * dVar3) + -0.5) * -50.0);
            uVar13 = -(ulong)(dVar16 + 1.0 < dVar3 * 0.5 * dVar3);
            scalar[lVar11] =
                 (REF_DBL)(~uVar13 & (ulong)(1.0 - dVar2) |
                          (ulong)((uint)(uVar13 >> 0x20) & 0x40000000) << 0x20);
          }
          else {
            iVar6 = strcmp(function_name,"combo1");
            local_98 = auVar4._0_8_;
            dStack_90 = auVar4._8_8_;
            if (iVar6 == 0) {
              dVar2 = local_98 + local_98 + -1.0;
              local_98 = pow(dVar2,3.0);
              local_98 = (dStack_90 + dStack_90 + -1.0) * dVar2 * 15.0 - local_98;
LAB_0010ffaa:
              dVar2 = tanh(local_98);
            }
            else {
              iVar6 = strcmp(function_name,"combo2");
              if (iVar6 == 0) {
                local_98 = (dStack_90 + dStack_90 + -1.0) * (local_98 + local_98 + -1.0) + -0.5;
LAB_0010ffa2:
                local_98 = local_98 * 50.0;
                goto LAB_0010ffaa;
              }
              iVar6 = strcmp(function_name,"sin50xy");
              if (iVar6 == 0) {
                dVar2 = (dStack_90 + dStack_90 + -1.0) * (local_98 + local_98 + -1.0);
                dVar16 = dVar2;
                if (dVar2 <= -dVar2) {
                  dVar16 = -dVar2;
                }
                if (dVar16 <= 0.0628318530717958) {
                  dVar2 = sin(dVar2 * 50.0);
                }
                else {
                  dVar2 = sin(dVar2 * 50.0);
                  if (0.1256637061435916 < dVar16) {
                    dVar2 = dVar2 * 0.01;
                  }
                }
              }
              else {
                iVar6 = strcmp(function_name,"sinfun3");
                if (iVar6 != 0) {
                  iVar6 = strcmp(function_name,"sinatan3");
                  if (iVar6 == 0) {
                    dVar2 = dVar2 * local_98;
                    dVar16 = sin(dVar2 * 50.0);
                    dVar3 = sin(dVar3 * 5.0);
                    dVar2 = atan(0.1 / (dVar3 - (dVar2 + dVar2)));
                    dVar2 = dVar16 * 0.1 + dVar2;
LAB_0011015d:
                    scalar[lVar11] = dVar2;
                    goto LAB_0010ffb5;
                  }
                  iVar6 = strcmp(function_name,"tanh3");
                  if (iVar6 == 0) {
                    dVar16 = pow(local_98 + 1.3,20.0);
                    dVar3 = pow(dVar3 + -0.3,9.0);
                    local_98 = dVar3 * dVar16 * dVar2;
                    goto LAB_0010ffaa;
                  }
                  iVar6 = strcmp(function_name,"bl3");
                  if (iVar6 == 0) {
                    dVar16 = exp((1.0 - local_98) / -0.01);
                    dVar3 = exp((1.0 - dStack_90) / -0.01);
                    dVar2 = exp((1.0 - dVar2) / -0.01);
                    dVar2 = 1.0 - (1.0 - dVar2) * (1.0 - dVar3) * (1.0 - dVar16);
                    goto LAB_0010ffaf;
                  }
                  iVar6 = strcmp(function_name,"uplus");
                  if (iVar6 == 0) {
                    uVar7 = ref_phys_spalding_uplus(dStack_90 * 10000.0,&local_68);
                    if (uVar7 != 0) {
                      pcVar10 = "uplus";
                      uVar9 = 0x131;
                      goto LAB_00110656;
                    }
                    dVar2 = local_98 * 0.0005 * local_98 + local_68;
                  }
                  else {
                    iVar6 = strcmp(function_name,"circgap");
                    if (iVar6 == 0) {
                      uVar14 = (int)((ulong)dVar3 >> 0x20);
                      if (dVar3 <= -dVar3) {
                        uVar14 = (int)((ulong)-dVar3 >> 0x20);
                      }
                      uVar7 = ref_phys_spalding_uplus
                                        ((double)CONCAT44(uVar14,SUB84(dVar3,0)) * 10000.0,&local_68
                                        );
                      if (uVar7 != 0) {
                        pcVar10 = "uplus";
                        uVar9 = 0x13d;
LAB_00110656:
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c"
                               ,uVar9,"ref_acceptance_u",(ulong)uVar7,pcVar10);
                        return uVar7;
                      }
                      uVar7 = ref_phys_spalding_uplus
                                        ((SQRT(local_98 * local_98 + (dVar3 + 1.1) * (dVar3 + 1.1))
                                         + -1.0) * 10000.0,&local_38);
                      if (uVar7 != 0) {
                        pcVar10 = "uplus";
                        uVar9 = 0x140;
                        goto LAB_00110656;
                      }
                      uVar14 = SUB84(local_68,0);
                      uVar15 = (undefined4)((ulong)local_68 >> 0x20);
                      if (local_38 <= local_68) {
                        uVar14 = SUB84(local_38,0);
                        uVar15 = (undefined4)((ulong)local_38 >> 0x20);
                      }
                      iVar6 = (int)(double)CONCAT44(uVar15,uVar14);
                      if (iVar6 < 0x1a) {
                        iVar6 = 0x19;
                      }
                      scalar[lVar11] =
                           (double)(iVar6 + -0x19) * 25.0 + (double)CONCAT44(uVar15,uVar14);
                      goto LAB_0010ffb5;
                    }
                    iVar6 = strcmp(function_name,"sphuplus");
                    if (iVar6 == 0) {
                      uVar7 = ref_phys_spalding_uplus
                                        ((SQRT((dVar2 + -1.0) * (dVar2 + -1.0) +
                                               (local_98 + -1.0) * (local_98 + -1.0) +
                                               (dStack_90 + -1.0) * (dStack_90 + -1.0)) + -0.5) *
                                         10000.0,&local_68);
                      dVar2 = local_68;
                      if (uVar7 != 0) {
                        pcVar10 = "uplus";
                        uVar9 = 0x14d;
                        goto LAB_00110656;
                      }
                    }
                    else {
                      iVar6 = strcmp(function_name,"cyluplus");
                      if (iVar6 == 0) {
                        uVar7 = ref_phys_spalding_uplus
                                          ((SQRT(local_98 * local_98 + dStack_90 * dStack_90) + -0.5
                                           ) * 10000.0,&local_68);
                        dVar2 = local_68;
                        if (uVar7 != 0) {
                          pcVar10 = "uplus";
                          uVar9 = 0x156;
                          goto LAB_00110656;
                        }
                      }
                      else {
                        iVar6 = strcmp(function_name,"dist");
                        if (iVar6 != 0) {
                          iVar6 = strcmp(function_name,"parabola");
                          if (iVar6 == 0) {
                            local_98 = local_98 - dStack_90 * dStack_90;
                            goto LAB_0010ffa2;
                          }
                          iVar6 = strcmp(function_name,"one");
                          if (iVar6 == 0) {
                            RVar8 = 1.0;
                          }
                          else {
                            iVar6 = strcmp(function_name,"half");
                            if (iVar6 != 0) {
                              iVar6 = strcmp(function_name,"lisbon");
                              if (iVar6 == 0) {
                                uVar7 = ref_acceptance_u_lisbon(local_98,dStack_90,&local_68);
                                dVar2 = local_68;
                                if (uVar7 != 0) {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c"
                                         ,0x166,"ref_acceptance_u",(ulong)uVar7,"lisbon");
                                  return 1;
                                }
                                goto LAB_0010ffaf;
                              }
                              iVar6 = strcmp(function_name,"fp-sa");
                              if (iVar6 != 0) {
                                iVar6 = strcmp(function_name,"trig");
                                if (iVar6 != 0) {
                                  printf("%s: %d: %s %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c"
                                         ,0x181,"unknown user function",function_name);
                                  return 5;
                                }
                                ref_acceptance_primal_trig(dVar16,dStack_90,&local_68);
                                dVar5 = local_50;
                                dVar3 = local_58;
                                dVar16 = local_60;
                                dVar2 = (local_48 * 1.4) / local_68;
                                if (dVar2 < 0.0) {
                                  dVar2 = sqrt(dVar2);
                                }
                                else {
                                  dVar2 = SQRT(dVar2);
                                }
                                dVar2 = SQRT(dVar5 * dVar5 + dVar16 * dVar16 + dVar3 * dVar3) /
                                        dVar2;
                                goto LAB_0011015d;
                              }
                              uVar7 = ref_acceptance_primal_fp_sa(dStack_90,&local_68);
                              if (uVar7 != 0) {
                                pcVar10 = "flat plate sa";
                                uVar9 = 0x16b;
                                goto LAB_00110656;
                              }
                              dVar2 = SQRT(local_50 * local_50 +
                                           local_60 * local_60 + local_58 * local_58);
                              goto LAB_00110429;
                            }
                            scalar[lVar11] = 1.0;
                            if (0.5 <= dStack_90) goto LAB_0010ffb5;
                            RVar8 = 0.5;
                          }
                          scalar[lVar11] = RVar8;
                          goto LAB_0010ffb5;
                        }
                        dVar2 = SQRT(local_98 * local_98 + dStack_90 * dStack_90) + -0.5;
                      }
                    }
                  }
LAB_00110429:
                  scalar[lVar11] = dVar2;
                  goto LAB_0010ffb5;
                }
                dVar16 = (dVar2 + -0.4) * (dStack_90 + -0.4) * (local_98 + -0.4);
                if (dVar16 <= -0.0628318530717958) {
                  dVar2 = sin(dVar16 * 50.0);
                }
                else {
                  dVar2 = sin(dVar16 * 50.0);
                  if (dVar16 <= 0.1256637061435916) goto LAB_0010ffaf;
                }
                dVar2 = dVar2 * 0.1;
              }
            }
LAB_0010ffaf:
            scalar[lVar11] = dVar2;
          }
        }
      }
LAB_0010ffb5:
      lVar11 = lVar11 + 1;
      lVar12 = lVar12 + 0xf;
    } while (lVar11 < ref_node->max);
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_acceptance_u(REF_NODE ref_node,
                                           const char *function_name,
                                           REF_DBL *scalar) {
  REF_INT node;
  REF_DBL x, y, z;
  each_ref_node_valid_node(ref_node, node) {
    x = ref_node_xyz(ref_node, 0, node);
    y = ref_node_xyz(ref_node, 1, node);
    z = ref_node_xyz(ref_node, 2, node);
    if (strcmp(function_name, "u5") == 0) {
      scalar[node] = 2.0 * pow(x, 2) + 2.0 * pow(y, 2) + 2.0 * pow(z, 2);
    } else if (strcmp(function_name, "supcyl") == 0) {
      REF_DBL r;
      r = sqrt(x * x + y * y) - 0.5;
      scalar[node] = 1.0 - exp(-50.0 * r);
      if ((x - (-1.0)) < 0.5 * y * y) scalar[node] = 2.0;
    } else if (strcmp(function_name, "combo1") == 0) {
      REF_DBL xy, x3;
      xy = (2.0 * x - 1.0) * (2.0 * y - 1.0);
      x3 = pow((2.0 * x - 1.0), 3);
      scalar[node] = tanh(15.0 * xy - x3);
    } else if (strcmp(function_name, "combo2") == 0) {
      REF_DBL xy;
      xy = (2.0 * x - 1.0) * (2.0 * y - 1.0);
      scalar[node] = tanh(50.0 * (xy - 0.5));
    } else if (strcmp(function_name, "sin50xy") == 0) {
      REF_DBL xy;
      xy = (2.0 * x - 1.0) * (2.0 * y - 1.0);
      if (ABS(xy) <= (ref_math_pi / 50.0)) {
        scalar[node] = sin(50.0 * xy);
      } else if (ABS(xy) <= 2.0 * (ref_math_pi / 50.0)) {
        scalar[node] = sin(50.0 * xy);
      } else {
        scalar[node] = 0.01 * sin(50.0 * xy);
      }
    } else if (strcmp(function_name, "sinfun3") == 0) {
      REF_DBL xyz;
      xyz = (x - 0.4) * (y - 0.4) * (z - 0.4); /* sphere2 */
      if (xyz <= (-1.0 * ref_math_pi / 50.0)) {
        scalar[node] = 0.1 * sin(50. * xyz);
      } else if (xyz <= (2.0 * ref_math_pi / 50.0)) {
        scalar[node] = sin(50.0 * xyz);
      } else {
        scalar[node] = 0.1 * sin(50.0 * xyz);
      }
    } else if (strcmp(function_name, "sinatan3") == 0) {
      REF_DBL eps = 0.1;
      REF_DBL xz;
      xz = x * z;
      scalar[node] =
          0.1 * sin(50.0 * xz) + atan(eps / (sin(5.0 * y) - 2.0 * xz));
    } else if (strcmp(function_name, "tanh3") == 0) {
      scalar[node] = tanh(pow(x + 1.3, 20.0) * pow(y - 0.3, 9.0) * z);
    } else if (strcmp(function_name, "bl3") == 0) {
      REF_DBL f, g, h;
      REF_DBL a = 1.0;
      REF_DBL b = 1.0;
      REF_DBL c = 1.0;
      REF_DBL nu = 0.01;
      REF_DBL scale = -1;
      REF_DBL offset = 1;
      f = (1.0 - exp(-a * (1.0 - x) / nu)) / (1.0 - exp(-a / nu));
      g = (1.0 - exp(-b * (1.0 - y) / nu)) / (1.0 - exp(-b / nu));
      h = (1.0 - exp(-c * (1.0 - z) / nu)) / (1.0 - exp(-c / nu));
      scalar[node] = scale * f * g * h + offset;
    } else if (strcmp(function_name, "uplus") == 0) {
      REF_DBL uplus, yplus, scale;
      scale = 1.0e4;
      yplus = scale * y;
      RSS(ref_phys_spalding_uplus(yplus, &uplus), "uplus");
      scalar[node] = uplus + 5.0e-4 * x * x;
    } else if (strcmp(function_name, "circgap") == 0) {
      REF_DBL uplus0, uplus1, uplus, combined;
      REF_INT step;
      REF_DBL yplus0, yplus1, gap, r, radius, center, scale, hop;
      radius = 1.0;
      gap = 0.1;
      center = -gap - radius;
      scale = 1.0e4;
      hop = 25.0;
      yplus0 = scale * ABS(y);
      RSS(ref_phys_spalding_uplus(yplus0, &uplus0), "uplus");
      r = sqrt(x * x + (y - center) * (y - center));
      yplus1 = scale * (r - radius);
      RSS(ref_phys_spalding_uplus(yplus1, &uplus1), "uplus");
      uplus = MIN(uplus0, uplus1);
      step = MAX(0, (REF_INT)uplus - 25);
      combined = uplus + hop * (REF_DBL)step;
      scalar[node] = combined;
    } else if (strcmp(function_name, "sphuplus") == 0) {
      REF_DBL x0 = 1, y0 = 1, z0 = 1;
      REF_DBL uplus;
      REF_DBL yplus, r, radius, scale;
      radius = 0.5;
      scale = 1.0e4;
      r = sqrt((x - x0) * (x - x0) + (y - y0) * (y - y0) + (z - z0) * (z - z0));
      yplus = scale * (r - radius);
      RSS(ref_phys_spalding_uplus(yplus, &uplus), "uplus");
      scalar[node] = uplus;
    } else if (strcmp(function_name, "cyluplus") == 0) {
      REF_DBL uplus;
      REF_DBL yplus, r, radius, scale;
      radius = 0.5;
      scale = 1.0e4;
      r = sqrt(x * x + y * y);
      yplus = scale * (r - radius);
      RSS(ref_phys_spalding_uplus(yplus, &uplus), "uplus");
      scalar[node] = uplus;
    } else if (strcmp(function_name, "dist") == 0) {
      REF_DBL r, radius;
      radius = 0.5;
      r = sqrt(x * x + y * y);
      scalar[node] = (r - radius);
    } else if (strcmp(function_name, "parabola") == 0) {
      scalar[node] = tanh(50 * (x - y * y));
    } else if (strcmp(function_name, "one") == 0) {
      scalar[node] = 1.0;
    } else if (strcmp(function_name, "half") == 0) {
      scalar[node] = 1.0;
      if (y < 0.5) scalar[node] = 0.5;
    } else if (strcmp(function_name, "lisbon") == 0) {
      REF_DBL vel;
      RSS(ref_acceptance_u_lisbon(x, y, &vel), "lisbon");
      scalar[node] = vel;
    } else if (strcmp(function_name, "fp-sa") == 0) {
      REF_DBL u, v, w;
      REF_DBL primitive[6];
      RSS(ref_acceptance_primal_fp_sa(y, primitive), "flat plate sa");
      u = primitive[1];
      v = primitive[2];
      w = primitive[3];
      scalar[node] = sqrt(u * u + v * v + w * w);
    } else if (strcmp(function_name, "trig") == 0) {
      REF_DBL rho, pressure, u, v, w, mach;
      REF_DBL primitive[5];
      x = ref_node_xyz(ref_node, 0, node);
      y = ref_node_xyz(ref_node, 1, node);
      RSS(ref_acceptance_primal_trig(ref_node_xyz(ref_node, 0, node),
                                     ref_node_xyz(ref_node, 1, node),
                                     primitive),
          "coax");
      rho = primitive[0];
      u = primitive[1];
      v = primitive[2];
      w = primitive[3];
      pressure = primitive[4];
      mach = sqrt(u * u + v * v + w * w) / sqrt(1.4 * pressure / rho);
      scalar[node] = mach;
    } else {
      printf("%s: %d: %s %s\n", __FILE__, __LINE__, "unknown user function",
             function_name);
      return REF_NOT_FOUND;
    }
  }
  return REF_SUCCESS;
}